

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O2

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_Fixpp::FieldRef<Fixpp::TagT<375U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<337U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<437U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,Fixpp::FieldRef<Fixpp::TagT<375u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<337u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<437u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<438u,Fixpp::Type::UTCTimestamp>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,Fixpp::FieldRef<Fixpp::TagT<375u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<337u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<437u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<438u,Fixpp::Type::UTCTimestamp>>>
            *this,tuple<Fixpp::FieldRef<Fixpp::TagT<375U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<337U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<437U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>
                  *v)

{
  *(char **)this =
       (v->base).
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<375U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 8) =
       (v->base).
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<375U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x10) =
       (v->base).
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<337U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x18) =
       (v->base).
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<337U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x20) =
       (v->base).
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<437U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x28) =
       (v->base).
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<437U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x30) =
       (v->base).
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>,_false>
       .value.m_view.first;
  *(unsigned_long *)(this + 0x38) =
       (v->base).
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>,_false>
       .value.m_view.second;
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_Fixpp::FieldRef<Fixpp::TagT<375U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<337U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<437U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<438U,_Fixpp::Type::UTCTimestamp>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( const tuple< Us... >& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, const Us& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( v ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( v ) ), true )..., true };
#endif
        return *this;
      }